

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> __thiscall
capnp::SchemaLoader::Impl::makeBrandedDependencies
          (Impl *this,RawSchema *schema,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *bindings)

{
  uint uVar1;
  unsigned_short uVar2;
  uint uVar3;
  long lVar4;
  RawBrandedSchema *pRVar5;
  Reader brand;
  Reader type;
  Reader type_00;
  Reader brand_00;
  Reader brand_01;
  Dependency *pDVar6;
  RemoveConst<capnp::_::RawBrandedSchema::Dependency> *pRVar7;
  CapTableReader *pCVar8;
  ulong uVar9;
  RawSchema *schema_00;
  anon_union_8_2_eba6ea51_for_Binding_4 aVar10;
  int iVar11;
  long lVar12;
  uint64_t uVar13;
  size_t sVar14;
  ElementCount index;
  unsigned_long i;
  ulong uVar15;
  undefined1 *puVar16;
  Dependency *__i;
  Dependency *pDVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  ArrayPtr<const_char> scopeName;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar22;
  StringPtr name;
  Vector<capnp::_::RawBrandedSchema::Dependency> deps;
  Reader superclass;
  Reader node;
  Reader superclasses;
  Vector<capnp::_::RawBrandedSchema::Dependency> local_278;
  StructReader local_258;
  Impl *local_228;
  ushort local_21a;
  Binding local_218;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
  *local_208;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
  *local_200;
  StructReader local_1f8;
  ArrayPtr<const_char> local_1c8;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_1b8;
  int local_19c;
  StructReader local_198;
  long local_160;
  SegmentReader *local_158;
  undefined1 local_150 [24];
  uint local_138;
  StructReader local_120;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  local_198.data = schema->encodedNode;
  local_198.segment = (SegmentReader *)0x0;
  local_198.capTable = (CapTableReader *)0x0;
  local_198.pointers._0_4_ = 0x7fffffff;
  local_228 = this;
  _::PointerReader::getStruct(&local_258,(PointerReader *)&local_198,(word *)0x0);
  local_198.data = (WirePointer *)0x0;
  local_198.pointers._0_4_ = 0x7fffffff;
  if (local_258.pointerCount != 0) {
    local_198.data = local_258.pointers;
    local_198.pointers._0_4_ = local_258.nestingLimit;
  }
  uVar18 = 0;
  uVar19 = 0;
  uVar20 = 0;
  uVar21 = 0;
  if (local_258.pointerCount != 0) {
    uVar18 = local_258.segment._0_4_;
    uVar19 = local_258.segment._4_4_;
    uVar20 = local_258.capTable._0_4_;
    uVar21 = local_258.capTable._4_4_;
  }
  local_198.segment = (SegmentReader *)CONCAT44(uVar19,uVar18);
  local_198.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
  scopeName = (ArrayPtr<const_char>)
              _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_198,(void *)0x0,0);
  local_278.builder.ptr = (Dependency *)0x0;
  local_278.builder.pos = (Dependency *)0x0;
  local_278.builder.endPtr = (Dependency *)0x0;
  local_278.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  local_258.data = schema->encodedNode;
  local_258.segment = (SegmentReader *)0x0;
  local_258.capTable = (CapTableReader *)0x0;
  local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,0x7fffffff);
  _::PointerReader::getStruct(&local_198,(PointerReader *)&local_258,(word *)0x0);
  if (0x6f < local_198.dataSize) {
    uVar2 = (((WirePointer *)((long)local_198.data + 8))->field_1).structRef.dataSize.value;
    if (uVar2 == 1) {
      local_258.data = (word *)(CONCAT44(local_198.pointers._4_4_,(int)local_198.pointers) + 0x18);
      if (local_198.pointerCount < 4) {
        local_258.data = (word *)0x0;
      }
      uVar18 = local_198.segment._0_4_;
      uVar19 = local_198.segment._4_4_;
      uVar20 = local_198.capTable._0_4_;
      uVar21 = local_198.capTable._4_4_;
      if (local_198.pointerCount < 4) {
        uVar18 = 0;
        uVar19 = 0;
        uVar20 = 0;
        uVar21 = 0;
        local_198.nestingLimit = 0x7fffffff;
      }
      local_258.segment = (SegmentReader *)CONCAT44(uVar19,uVar18);
      local_258.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
      local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,local_198.nestingLimit);
      _::PointerReader::getList
                ((ListReader *)local_150,(PointerReader *)&local_258,INLINE_COMPOSITE,(word *)0x0);
      if ((ulong)local_138 != 0) {
        local_208 = &(bindings->ptr).field_1;
        uVar9 = 0;
        do {
          _::ListReader::getStructElement(&local_1f8,(ListReader *)local_150,(ElementCount)uVar9);
          if ((local_1f8.dataSize < 0x50) || ((short)*(uint64_t *)((long)local_1f8.data + 8) == 0))
          {
            local_258.data = local_1f8.pointers + 2;
            if (local_1f8.pointerCount < 3) {
              local_258.data = (WirePointer *)0x0;
              uVar18 = 0;
              uVar19 = 0;
              uVar20 = 0;
              uVar21 = 0;
              iVar11 = 0x7fffffff;
            }
            else {
              uVar18 = local_1f8.segment._0_4_;
              uVar19 = local_1f8.segment._4_4_;
              uVar20 = local_1f8.capTable._0_4_;
              uVar21 = local_1f8.capTable._4_4_;
              iVar11 = local_1f8.nestingLimit;
            }
            local_258.segment = (SegmentReader *)CONCAT44(uVar19,uVar18);
            local_258.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
            local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar11);
            _::PointerReader::getStruct(&local_90,(PointerReader *)&local_258,(word *)0x0);
            local_1b8.ptr.isSet = (bindings->ptr).isSet;
            if (local_1b8.ptr.isSet != false) {
              local_1b8.ptr.field_1.value.ptr = (local_208->value).ptr;
              local_1b8.ptr.field_1.value.size_ = (local_208->value).size_;
            }
            local_258.nestingLimit = local_90.nestingLimit;
            local_258._44_4_ = local_90._44_4_;
            local_258.dataSize = local_90.dataSize;
            local_258.pointerCount = local_90.pointerCount;
            local_258._38_2_ = local_90._38_2_;
            local_258.pointers = local_90.pointers;
            local_258.data = local_90.data;
            local_258.capTable = local_90.capTable;
            local_258.segment = local_90.segment;
            local_218.which = '\0';
            local_218.isImplicitParameter = false;
            local_218.listDepth = 0;
            local_218.paramIndex = 0;
            local_218._6_2_ = 0;
            local_218.field_4.schema = (RawBrandedSchema *)0x0;
            type._reader.capTable = local_90.capTable;
            type._reader.segment = local_90.segment;
            type._reader.data = local_90.data;
            type._reader.pointers = local_90.pointers;
            type._reader.dataSize = local_90.dataSize;
            type._reader.pointerCount = local_90.pointerCount;
            type._reader._38_2_ = local_90._38_2_;
            type._reader.nestingLimit = local_90.nestingLimit;
            type._reader._44_4_ = local_90._44_4_;
            makeDep(local_228,&local_218,type,(StringPtr)scopeName,&local_1b8);
            aVar10 = local_218.field_4;
            if (local_218.field_4.schema != (RawBrandedSchema *)0x0) {
              if (local_278.builder.pos == local_278.builder.endPtr) {
                sVar14 = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 3;
                if (local_278.builder.pos == local_278.builder.ptr) {
                  sVar14 = 4;
                }
                kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar14);
              }
              goto LAB_00138e37;
            }
          }
          else if ((short)*(uint64_t *)((long)local_1f8.data + 8) == 1) {
            if (local_1f8.dataSize < 0xc0) {
              uVar13 = 0;
            }
            else {
              uVar13 = *(uint64_t *)((long)local_1f8.data + 0x10);
            }
            name.content.size_ = 0x15;
            name.content.ptr = "(unknown group type)";
            schema_00 = loadEmpty(local_228,uVar13,name,STRUCT,true);
            if ((bindings->ptr).isSet == true) {
              aVar10.schema = makeBranded(local_228,schema_00,(bindings->ptr).field_1.value);
              if (aVar10.schema != (RawBrandedSchema *)0x0) {
                if (local_278.builder.pos == local_278.builder.endPtr) {
                  sVar14 = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 3;
                  if (local_278.builder.pos == local_278.builder.ptr) {
                    sVar14 = 4;
                  }
                  kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar14)
                  ;
                }
                goto LAB_00138e37;
              }
            }
            else {
              aVar10.schema = getUnbound(local_228,schema_00);
              if (aVar10.schema != (RawBrandedSchema *)0x0) {
                if (local_278.builder.pos == local_278.builder.endPtr) {
                  sVar14 = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 3;
                  if (local_278.builder.pos == local_278.builder.ptr) {
                    sVar14 = 4;
                  }
                  kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar14)
                  ;
                }
LAB_00138e37:
                *(undefined8 *)local_278.builder.pos = 0;
                (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
                *(undefined8 *)local_278.builder.pos = 0;
                (local_278.builder.pos)->location = (ElementCount)uVar9 | 0x1000000;
                (local_278.builder.pos)->schema = (RawBrandedSchema *)aVar10;
                local_278.builder.pos = local_278.builder.pos + 1;
              }
            }
          }
          uVar9 = uVar9 + 1;
        } while (local_138 != uVar9);
      }
    }
    else if (uVar2 == 3) {
      local_160 = CONCAT44(local_198.pointers._4_4_,(int)local_198.pointers);
      local_21a = local_198.pointerCount;
      if (local_198.pointerCount < 5) {
        iVar11 = 0x7fffffff;
        local_258.capTable = (CapTableReader *)0x0;
        local_258.data = (void *)0x0;
        local_258.segment = (SegmentReader *)0x0;
      }
      else {
        local_258.data = (void *)(local_160 + 0x20);
        local_258.capTable = local_198.capTable;
        local_258.segment = local_198.segment;
        iVar11 = local_198.nestingLimit;
      }
      local_158 = local_198.segment;
      local_19c = local_198.nestingLimit;
      local_200 = (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
                   *)local_198.capTable;
      local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar11);
      _::PointerReader::getList
                ((ListReader *)local_150,(PointerReader *)&local_258,INLINE_COMPOSITE,(word *)0x0);
      uVar9 = (ulong)local_138;
      if (uVar9 != 0) {
        local_208 = &(bindings->ptr).field_1;
        uVar15 = 0;
        do {
          _::ListReader::getStructElement(&local_1f8,(ListReader *)local_150,(ElementCount)uVar15);
          if (local_1f8.dataSize < 0x40) {
            uVar13 = 0;
          }
          else {
            uVar13 = *local_1f8.data;
          }
          iVar11 = local_1f8.nestingLimit;
          local_258.data = local_1f8.pointers;
          if (local_1f8.pointerCount == 0) {
            local_258.data = (WirePointer *)0x0;
            iVar11 = 0x7fffffff;
          }
          uVar18 = 0;
          uVar19 = 0;
          uVar20 = 0;
          uVar21 = 0;
          if (local_1f8.pointerCount != 0) {
            uVar18 = local_1f8.segment._0_4_;
            uVar19 = local_1f8.segment._4_4_;
            uVar20 = local_1f8.capTable._0_4_;
            uVar21 = local_1f8.capTable._4_4_;
          }
          local_258.segment = (SegmentReader *)CONCAT44(uVar19,uVar18);
          local_258.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
          local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar11);
          _::PointerReader::getStruct(&local_c0,(PointerReader *)&local_258,(word *)0x0);
          local_1b8.ptr.isSet = (bindings->ptr).isSet;
          if (local_1b8.ptr.isSet == true) {
            local_1b8.ptr.field_1.value.ptr = (local_208->value).ptr;
            local_1b8.ptr.field_1.value.size_ = (local_208->value).size_;
          }
          local_258.segment = local_c0.segment;
          local_258.capTable = local_c0.capTable;
          local_258.data = local_c0.data;
          local_258.pointers = local_c0.pointers;
          local_258.dataSize = local_c0.dataSize;
          local_258.pointerCount = local_c0.pointerCount;
          local_258._38_2_ = local_c0._38_2_;
          local_258.nestingLimit = local_c0.nestingLimit;
          local_258._44_4_ = local_c0._44_4_;
          local_218.which = '\0';
          local_218.isImplicitParameter = false;
          local_218.listDepth = 0;
          local_218.paramIndex = 0;
          local_218._6_2_ = 0;
          local_218.field_4.schema = (RawBrandedSchema *)0x0;
          brand._reader.capTable = local_c0.capTable;
          brand._reader.segment = local_c0.segment;
          brand._reader.data = local_c0.data;
          brand._reader.pointers = local_c0.pointers;
          brand._reader.dataSize = local_c0.dataSize;
          brand._reader.pointerCount = local_c0.pointerCount;
          brand._reader._38_2_ = local_c0._38_2_;
          brand._reader.nestingLimit = local_c0.nestingLimit;
          brand._reader._44_4_ = local_c0._44_4_;
          local_1c8 = scopeName;
          makeDep(local_228,&local_218,uVar13,INTERFACE,INTERFACE,brand,(StringPtr)scopeName,
                  &local_1b8);
          aVar10 = local_218.field_4;
          if (local_218.field_4.schema != (RawBrandedSchema *)0x0) {
            if (local_278.builder.pos == local_278.builder.endPtr) {
              sVar14 = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 3;
              if (local_278.builder.pos == local_278.builder.ptr) {
                sVar14 = 4;
              }
              kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar14);
            }
            *(undefined8 *)local_278.builder.pos = 0;
            (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
            *(undefined8 *)local_278.builder.pos = 0;
            (local_278.builder.pos)->location = (ElementCount)uVar15 | 0x4000000;
            (local_278.builder.pos)->schema = (RawBrandedSchema *)aVar10;
            local_278.builder.pos = local_278.builder.pos + 1;
          }
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
      }
      if (local_21a < 4) {
        iVar11 = 0x7fffffff;
        local_258.capTable = (CapTableReader *)0x0;
        local_258.data = (word *)0x0;
        local_258.segment = (SegmentReader *)0x0;
      }
      else {
        local_258.data = (void *)(local_160 + 0x18);
        local_258.capTable = (CapTableReader *)local_200;
        local_258.segment = local_158;
        iVar11 = local_19c;
      }
      local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar11);
      _::PointerReader::getList
                ((ListReader *)local_150,(PointerReader *)&local_258,INLINE_COMPOSITE,(word *)0x0);
      local_208 = (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
                   *)(ulong)local_138;
      if (local_208 !=
          (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
           *)0x0) {
        local_200 = &(bindings->ptr).field_1;
        puVar16 = (undefined1 *)0x0;
        do {
          index = (ElementCount)puVar16;
          _::ListReader::getStructElement(&local_1f8,(ListReader *)local_150,index);
          if (local_1f8.dataSize < 0x80) {
            uVar13 = 0;
          }
          else {
            uVar13 = *(uint64_t *)((long)local_1f8.data + 8);
          }
          local_258.data = local_1f8.pointers + 2;
          if (local_1f8.pointerCount < 3) {
            local_258.data = (WirePointer *)0x0;
            uVar18 = 0;
            uVar19 = 0;
            uVar20 = 0;
            uVar21 = 0;
            iVar11 = 0x7fffffff;
          }
          else {
            uVar18 = local_1f8.segment._0_4_;
            uVar19 = local_1f8.segment._4_4_;
            uVar20 = local_1f8.capTable._0_4_;
            uVar21 = local_1f8.capTable._4_4_;
            iVar11 = local_1f8.nestingLimit;
          }
          local_258.segment = (SegmentReader *)CONCAT44(uVar19,uVar18);
          local_258.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
          local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar11);
          _::PointerReader::getStruct(&local_f0,(PointerReader *)&local_258,(word *)0x0);
          local_1b8.ptr.isSet = (bindings->ptr).isSet;
          if (local_1b8.ptr.isSet == true) {
            local_1b8.ptr.field_1.value.ptr = (local_200->value).ptr;
            local_1b8.ptr.field_1.value.size_ = (local_200->value).size_;
          }
          local_258.segment = local_f0.segment;
          local_258.capTable = local_f0.capTable;
          local_258.data = local_f0.data;
          local_258.pointers = local_f0.pointers;
          local_258.dataSize = local_f0.dataSize;
          local_258.pointerCount = local_f0.pointerCount;
          local_258._38_2_ = local_f0._38_2_;
          local_258.nestingLimit = local_f0.nestingLimit;
          local_258._44_4_ = local_f0._44_4_;
          local_218.which = '\0';
          local_218.isImplicitParameter = false;
          local_218.listDepth = 0;
          local_218.paramIndex = 0;
          local_218._6_2_ = 0;
          local_218.field_4.schema = (RawBrandedSchema *)0x0;
          brand_00._reader.capTable = local_f0.capTable;
          brand_00._reader.segment = local_f0.segment;
          brand_00._reader.data = local_f0.data;
          brand_00._reader.pointers = local_f0.pointers;
          brand_00._reader.dataSize = local_f0.dataSize;
          brand_00._reader.pointerCount = local_f0.pointerCount;
          brand_00._reader._38_2_ = local_f0._38_2_;
          brand_00._reader.nestingLimit = local_f0.nestingLimit;
          brand_00._reader._44_4_ = local_f0._44_4_;
          local_1c8 = scopeName;
          makeDep(local_228,&local_218,uVar13,STRUCT,STRUCT,brand_00,(StringPtr)scopeName,&local_1b8
                 );
          aVar10 = local_218.field_4;
          if (local_218.field_4.schema != (RawBrandedSchema *)0x0) {
            if (local_278.builder.pos == local_278.builder.endPtr) {
              sVar14 = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 3;
              if (local_278.builder.pos == local_278.builder.ptr) {
                sVar14 = 4;
              }
              kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar14);
            }
            *(undefined8 *)local_278.builder.pos = 0;
            (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
            *(undefined8 *)local_278.builder.pos = 0;
            (local_278.builder.pos)->location = index | 0x2000000;
            (local_278.builder.pos)->schema = (RawBrandedSchema *)aVar10;
            local_278.builder.pos = local_278.builder.pos + 1;
          }
          if (local_1f8.dataSize < 0xc0) {
            uVar13 = 0;
          }
          else {
            uVar13 = *(uint64_t *)((long)local_1f8.data + 0x10);
          }
          local_258.data = local_1f8.pointers + 3;
          if (local_1f8.pointerCount < 4) {
            local_258.data = (WirePointer *)0x0;
            uVar18 = 0;
            uVar19 = 0;
            uVar20 = 0;
            uVar21 = 0;
            iVar11 = 0x7fffffff;
          }
          else {
            uVar18 = local_1f8.segment._0_4_;
            uVar19 = local_1f8.segment._4_4_;
            uVar20 = local_1f8.capTable._0_4_;
            uVar21 = local_1f8.capTable._4_4_;
            iVar11 = local_1f8.nestingLimit;
          }
          local_258.segment = (SegmentReader *)CONCAT44(uVar19,uVar18);
          local_258.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
          local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar11);
          _::PointerReader::getStruct(&local_120,(PointerReader *)&local_258,(word *)0x0);
          local_1b8.ptr.isSet = (bindings->ptr).isSet;
          if (local_1b8.ptr.isSet == true) {
            local_1b8.ptr.field_1.value.ptr = (local_200->value).ptr;
            local_1b8.ptr.field_1.value.size_ = (local_200->value).size_;
          }
          local_258.segment = local_120.segment;
          local_258.capTable = local_120.capTable;
          local_258.data = local_120.data;
          local_258.pointers = local_120.pointers;
          local_258.dataSize = local_120.dataSize;
          local_258.pointerCount = local_120.pointerCount;
          local_258._38_2_ = local_120._38_2_;
          local_258.nestingLimit = local_120.nestingLimit;
          local_258._44_4_ = local_120._44_4_;
          local_218.which = '\0';
          local_218.isImplicitParameter = false;
          local_218.listDepth = 0;
          local_218.paramIndex = 0;
          local_218._6_2_ = 0;
          local_218.field_4.schema = (RawBrandedSchema *)0x0;
          brand_01._reader.capTable = local_120.capTable;
          brand_01._reader.segment = local_120.segment;
          brand_01._reader.data = local_120.data;
          brand_01._reader.pointers = local_120.pointers;
          brand_01._reader.dataSize = local_120.dataSize;
          brand_01._reader.pointerCount = local_120.pointerCount;
          brand_01._reader._38_2_ = local_120._38_2_;
          brand_01._reader.nestingLimit = local_120.nestingLimit;
          brand_01._reader._44_4_ = local_120._44_4_;
          local_1c8 = scopeName;
          makeDep(local_228,&local_218,uVar13,STRUCT,STRUCT,brand_01,(StringPtr)scopeName,&local_1b8
                 );
          aVar10 = local_218.field_4;
          if (local_218.field_4.schema != (RawBrandedSchema *)0x0) {
            if (local_278.builder.pos == local_278.builder.endPtr) {
              sVar14 = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 3;
              if (local_278.builder.pos == local_278.builder.ptr) {
                sVar14 = 4;
              }
              kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar14);
            }
            *(undefined8 *)local_278.builder.pos = 0;
            (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
            *(undefined8 *)local_278.builder.pos = 0;
            (local_278.builder.pos)->location = index | 0x3000000;
            (local_278.builder.pos)->schema = (RawBrandedSchema *)aVar10;
            local_278.builder.pos = local_278.builder.pos + 1;
          }
          puVar16 = puVar16 + 1;
        } while (local_208 !=
                 (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
                  *)puVar16);
      }
    }
    else if (uVar2 == 4) {
      local_258.data = (void *)(CONCAT44(local_198.pointers._4_4_,(int)local_198.pointers) + 0x18);
      if (local_198.pointerCount < 4) {
        local_258.data = (void *)0x0;
      }
      uVar18 = local_198.segment._0_4_;
      uVar19 = local_198.segment._4_4_;
      uVar20 = local_198.capTable._0_4_;
      uVar21 = local_198.capTable._4_4_;
      if (local_198.pointerCount < 4) {
        uVar18 = 0;
        uVar19 = 0;
        uVar20 = 0;
        uVar21 = 0;
        local_198.nestingLimit = 0x7fffffff;
      }
      local_258.segment = (SegmentReader *)CONCAT44(uVar19,uVar18);
      local_258.capTable = (CapTableReader *)CONCAT44(uVar21,uVar20);
      local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,local_198.nestingLimit);
      _::PointerReader::getStruct(&local_60,(PointerReader *)&local_258,(word *)0x0);
      local_150[0] = (bindings->ptr).isSet;
      if (local_150[0] != false) {
        local_150._8_8_ = (bindings->ptr).field_1.value.ptr;
        local_150._16_8_ = (bindings->ptr).field_1.value.size_;
      }
      local_258.nestingLimit = local_60.nestingLimit;
      local_258._44_4_ = local_60._44_4_;
      local_258.dataSize = local_60.dataSize;
      local_258.pointerCount = local_60.pointerCount;
      local_258._38_2_ = local_60._38_2_;
      local_258.pointers = local_60.pointers;
      local_258.data = local_60.data;
      local_258.capTable = local_60.capTable;
      local_258.segment = local_60.segment;
      local_1f8.segment = (SegmentReader *)0x0;
      local_1f8.capTable = (CapTableReader *)0x0;
      type_00._reader.capTable = local_60.capTable;
      type_00._reader.segment = local_60.segment;
      type_00._reader.data = local_60.data;
      type_00._reader.pointers = local_60.pointers;
      type_00._reader.dataSize = local_60.dataSize;
      type_00._reader.pointerCount = local_60.pointerCount;
      type_00._reader._38_2_ = local_60._38_2_;
      type_00._reader.nestingLimit = local_60.nestingLimit;
      type_00._reader._44_4_ = local_60._44_4_;
      makeDep(local_228,(Binding *)&local_1f8,type_00,(StringPtr)scopeName,
              (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)local_150);
      pCVar8 = local_1f8.capTable;
      if ((RawBrandedSchema *)local_1f8.capTable != (RawBrandedSchema *)0x0) {
        if (local_278.builder.pos == local_278.builder.endPtr) {
          sVar14 = 4;
          if (local_278.builder.pos != local_278.builder.ptr) {
            sVar14 = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 3;
          }
          kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar14);
        }
        *(undefined8 *)local_278.builder.pos = 0;
        (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
        *(undefined8 *)local_278.builder.pos = 0x5000000;
        (local_278.builder.pos)->schema = (RawBrandedSchema *)pCVar8;
        local_278.builder.pos = local_278.builder.pos + 1;
      }
    }
  }
  pRVar7 = local_278.builder.pos;
  pDVar6 = local_278.builder.ptr;
  if (local_278.builder.ptr != local_278.builder.pos) {
    lVar12 = (long)local_278.builder.pos - (long)local_278.builder.ptr;
    uVar9 = lVar12 >> 4;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<capnp::_::RawBrandedSchema::Dependency*,long,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
              (local_278.builder.ptr,local_278.builder.pos,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar12 < 0x101) {
      std::
      __insertion_sort<capnp::_::RawBrandedSchema::Dependency*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (pDVar6,pRVar7);
    }
    else {
      pDVar17 = pDVar6 + 0x10;
      std::
      __insertion_sort<capnp::_::RawBrandedSchema::Dependency*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (pDVar6,pDVar17);
      for (; pDVar17 != pRVar7; pDVar17 = pDVar17 + 1) {
        uVar3 = pDVar17->location;
        uVar18 = *(undefined4 *)((long)&pDVar17->schema + 4);
        local_258.capTable = (CapTableReader *)CONCAT44(local_258.capTable._4_4_,uVar18);
        local_258.segment = *(SegmentReader **)&pDVar17->field_0x4;
        uVar1 = pDVar17[-1].location;
        pDVar6 = pDVar17;
        while (uVar3 < uVar1) {
          uVar19 = *(undefined4 *)&pDVar6[-1].field_0x4;
          pRVar5 = pDVar6[-1].schema;
          pDVar6->location = pDVar6[-1].location;
          *(undefined4 *)&pDVar6->field_0x4 = uVar19;
          pDVar6->schema = pRVar5;
          uVar1 = pDVar6[-2].location;
          pDVar6 = pDVar6 + -1;
        }
        pDVar6->location = uVar3;
        *(SegmentReader **)&pDVar6->field_0x4 = local_258.segment;
        *(undefined4 *)((long)&pDVar6->schema + 4) = uVar18;
      }
    }
  }
  AVar22.size_ = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 4;
  AVar22.ptr = local_278.builder.ptr;
  AVar22 = copyDeduped<capnp::_::RawBrandedSchema::Dependency>(local_228,AVar22);
  pDVar17 = local_278.builder.endPtr;
  pRVar7 = local_278.builder.pos;
  pDVar6 = local_278.builder.ptr;
  if (local_278.builder.ptr != (Dependency *)0x0) {
    local_278.builder.ptr = (Dependency *)0x0;
    local_278.builder.pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
    local_278.builder.endPtr = (Dependency *)0x0;
    (*(code *)**(undefined8 **)local_278.builder.disposer)
              (local_278.builder.disposer,pDVar6,0x10,(long)pRVar7 - (long)pDVar6 >> 4,
               (long)pDVar17 - (long)pDVar6 >> 4,0);
  }
  return AVar22;
}

Assistant:

kj::ArrayPtr<const _::RawBrandedSchema::Dependency>
SchemaLoader::Impl::makeBrandedDependencies(
    const _::RawSchema* schema,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> bindings) {
  kj::StringPtr scopeName =
      readMessageUnchecked<schema::Node>(schema->encodedNode).getDisplayName();

  kj::Vector<_::RawBrandedSchema::Dependency> deps;

  schema::Node::Reader node = readMessageUnchecked<schema::Node>(schema->encodedNode);

#define ADD_ENTRY(kind, index, make) \
    if (const _::RawBrandedSchema* dep = make) { \
      auto& slot = deps.add(); \
      memset(&slot, 0, sizeof(slot)); \
      slot.location = _::RawBrandedSchema::makeDepLocation( \
        _::RawBrandedSchema::DepKind::kind, index); \
      slot.schema = dep; \
    }

  switch (node.which()) {
    case schema::Node::FILE:
    case schema::Node::ENUM:
    case schema::Node::ANNOTATION:
      break;

    case schema::Node::CONST:
      ADD_ENTRY(CONST_TYPE, 0, makeDepSchema(
          node.getConst().getType(), scopeName, bindings));
      break;

    case schema::Node::STRUCT: {
      auto fields = node.getStruct().getFields();
      for (auto i: kj::indices(fields)) {
        auto field = fields[i];
        switch (field.which()) {
          case schema::Field::SLOT:
            ADD_ENTRY(FIELD, i, makeDepSchema(
                field.getSlot().getType(), scopeName, bindings))
            break;
          case schema::Field::GROUP: {
            const _::RawSchema* group = loadEmpty(
                field.getGroup().getTypeId(),
                "(unknown group type)", schema::Node::STRUCT, true);
            KJ_IF_SOME(b, bindings) {
              ADD_ENTRY(FIELD, i, makeBranded(group, b));
            } else {
              ADD_ENTRY(FIELD, i, getUnbound(group));
            }
            break;
          }
        }
      }
      break;
    }

    case schema::Node::INTERFACE: {
      auto interface = node.getInterface();
      {
        auto superclasses = interface.getSuperclasses();
        for (auto i: kj::indices(superclasses)) {
          auto superclass = superclasses[i];
          ADD_ENTRY(SUPERCLASS, i, makeDepSchema(
              superclass.getId(), schema::Type::INTERFACE, schema::Node::INTERFACE,
              superclass.getBrand(), scopeName, bindings))
        }
      }
      {
        auto methods = interface.getMethods();
        for (auto i: kj::indices(methods)) {
          auto method = methods[i];
          ADD_ENTRY(METHOD_PARAMS, i, makeDepSchema(
              method.getParamStructType(), schema::Type::STRUCT, schema::Node::STRUCT,
              method.getParamBrand(), scopeName, bindings))
          ADD_ENTRY(METHOD_RESULTS, i, makeDepSchema(
              method.getResultStructType(), schema::Type::STRUCT, schema::Node::STRUCT,
              method.getResultBrand(), scopeName, bindings))
        }
      }
      break;
    }
  }